

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O2

void __thiscall
__gnu_cxx::new_allocator<spdlog::logger>::
construct<spdlog::logger,std::__cxx11::string,std::shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>>>
          (new_allocator<spdlog::logger> *this,logger *__p,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args,
          shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>_>
          *__args_1)

{
  sink_ptr local_58;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)__args);
  local_58.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (__args_1->
       super___shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2>
       )._M_ptr;
  local_58.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (__args_1->
       super___shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2>
       )._M_refcount._M_pi;
  (__args_1->
  super___shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2>
  )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__args_1->
  super___shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2>
  )._M_ptr = (element_type *)0x0;
  spdlog::logger::logger(__p,&local_40,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

logger(std::string name, It begin, It end)
        : name_(std::move(name))
        , sinks_(begin, end)
    {}